

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void __thiscall
BaseIndex::DB::DB(DB *this,path *path,size_t n_cache_size,bool f_memory,bool f_wipe,bool f_obfuscate
                 )

{
  long lVar1;
  long in_FS_OFFSET;
  DBParams *in_stack_000000a8;
  CDBWrapper *in_stack_000000b0;
  DBParams *in_stack_ffffffffffffff48;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fs::path::path(&in_stack_ffffffffffffff48->path,(path *)0x91a240);
  DB::anon_class_1_0_00000001::operator()(in_stack_ffffffffffffff50);
  CDBWrapper::CDBWrapper(in_stack_000000b0,in_stack_000000a8);
  DBParams::~DBParams(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BaseIndex::DB::DB(const fs::path& path, size_t n_cache_size, bool f_memory, bool f_wipe, bool f_obfuscate) :
    CDBWrapper{DBParams{
        .path = path,
        .cache_bytes = n_cache_size,
        .memory_only = f_memory,
        .wipe_data = f_wipe,
        .obfuscate = f_obfuscate,
        .options = [] { DBOptions options; node::ReadDatabaseArgs(gArgs, options); return options; }()}}
{}